

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O1

void small_alloc_info(small_alloc *alloc,void *ptr,size_t size,small_alloc_info *info)

{
  byte bVar1;
  int iVar2;
  small_mempool *psVar3;
  size_t sVar4;
  uint uVar5;
  uint uVar6;
  
  psVar3 = (small_mempool *)0x0;
  if (size <= alloc->objsize_max) {
    uVar5 = (alloc->small_class).size_shift_plus_1;
    uVar6 = (uint)size - uVar5;
    if ((uint)size < uVar5) {
      uVar6 = 0;
    }
    uVar6 = uVar6 >> ((byte)(alloc->small_class).ignore_bits_count & 0x1f);
    if ((alloc->small_class).effective_size <= uVar6) {
      bVar1 = (byte)(alloc->small_class).effective_bits;
      uVar5 = uVar6 >> (bVar1 & 0x1f);
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = (uVar6 >> ((byte)iVar2 & 0x1f)) + (iVar2 << (bVar1 & 0x1f));
    }
    psVar3 = alloc->small_mempool_cache + uVar6;
  }
  info->is_large = psVar3 == (small_mempool *)0x0;
  sVar4 = size;
  if (psVar3 != (small_mempool *)0x0) {
    sVar4 = (size_t)(psVar3->used_pool->pool).objsize;
  }
  info->real_size = sVar4;
  if (size <= sVar4) {
    return;
  }
  __assert_fail("info->real_size >= size",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c",
                0x1de,
                "void small_alloc_info(struct small_alloc *, void *, size_t, struct small_alloc_info *)"
               );
}

Assistant:

void
small_alloc_info(struct small_alloc *alloc, void *ptr, size_t size,
		 struct small_alloc_info *info)
{
	(void)ptr;
	struct small_mempool *small_mempool = small_mempool_search(alloc, size);
	info->is_large = small_mempool == NULL;
	if (info->is_large)
		info->real_size = size;
	else
		info->real_size = small_mempool->used_pool->pool.objsize;
	assert(info->real_size >= size);
}